

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-file.c
# Opt level: O0

void file_get_savefile(char *filename,size_t max,char *base,char *ext)

{
  uint uVar1;
  _Bool _Var2;
  uint32_t uVar3;
  uint local_2c;
  int count;
  char *ext_local;
  char *base_local;
  size_t max_local;
  char *filename_local;
  
  local_2c = 0;
  uVar3 = Rand_simple(1000000);
  strnfmt(filename,max,"%s%lu.%s",base,(ulong)uVar3,ext);
  while( true ) {
    uVar1 = local_2c;
    _Var2 = file_exists(filename);
    if (_Var2) {
      local_2c = local_2c + 1;
    }
    if (!_Var2 || 99 < (int)uVar1) break;
    uVar3 = Rand_simple(1000000);
    strnfmt(filename,max,"%s%lu%u.%s",base,(ulong)uVar3,(ulong)local_2c,ext);
  }
  return;
}

Assistant:

void file_get_savefile(char *filename, size_t max, const char *base,
	const char *ext)
{
	int count = 0;

	count = 0;

#ifdef DJGPP
	/* DOS needs a shorter file name */
	strnfmt(filename, max, "%s/temp.%s", dirname(base), ext);
	while (file_exists(filename) && (count++ < 100))
		strnfmt(filename, max, "%s/temp%u.%s", dirname(base), count,
			ext);
#else
	strnfmt(filename, max, "%s%lu.%s",
		base, (unsigned long)Rand_simple(1000000), ext);
	while (file_exists(filename) && (count++ < 100))
		strnfmt(filename, max, "%s%lu%u.%s",
			base, (unsigned long)Rand_simple(1000000), count, ext);
#endif /* ! DJGPP */
	return;
}